

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Performance::binaryOpVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numOperations,char *op)

{
  long *plVar1;
  string *psVar2;
  long *plVar3;
  undefined4 in_register_00000014;
  bool *__s;
  int iVar4;
  allocator<char> local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (0 < (int)this) {
    iVar4 = 0;
    do {
      __s = (bool *)CONCAT44(in_register_00000014,numOperations);
      if (iVar4 == 0) {
        __s = ::glcts::fixed_sample_locations_values + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_79);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_60 = *plVar3;
        lStack_58 = plVar1[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar3;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iVar4 = iVar4 + 1;
    } while ((int)this != iVar4);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

static string binaryOpVertexTemplate (int numOperations, const char* op)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"in highp vec4 a_position${NAME_SPEC};\n"
		"in mediump vec4 a_value${NAME_SPEC};\n"
		"out mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	mediump vec4 value = ";

	for (int i = 0; i < numOperations; i++)
		resultTemplate += string(i > 0 ? op : "") + "a_value${NAME_SPEC}";

	resultTemplate +=
		";\n"
		"	v_value${NAME_SPEC} = value;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}